

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimePolymorphicInlineCacheInfo.cpp
# Opt level: O3

void JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
               (Recycler *recycler,EntryPointPolymorphicInlineCacheInfo *runtimeInfo,
               CodeGenWorkItemIDL *jitInfo)

{
  undefined8 *puVar1;
  uint uVar2;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *pSVar3;
  code *pcVar4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  bool bVar7;
  BOOL BVar8;
  Recycler *pRVar9;
  PolymorphicInlineCacheInfoIDL *jitInfo_00;
  undefined4 *puVar10;
  PolymorphicInlineCacheInfoIDL *pPVar11;
  size_t sVar12;
  Type *pTVar13;
  type_info *ptVar14;
  ulong uVar15;
  undefined1 local_70 [8];
  TrackAllocData data;
  Type local_38;
  
  if (runtimeInfo != (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    ptVar14 = (type_info *)&runtimeInfo->inlineeInfo;
    local_70 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
    pPVar11 = (PolymorphicInlineCacheInfoIDL *)0x0;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_181aee2;
    data.filename._0_4_ = 0x1a;
    pRVar9 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    jitInfo_00 = (PolymorphicInlineCacheInfoIDL *)new<Memory::Recycler>(0x20,pRVar9,0x56b216);
    (jitInfo_00->polymorphicCacheUtilizationArray).ptr = (uchar *)0x0;
    (jitInfo_00->polymorphicInlineCaches).ptr = (PolymorphicInlineCacheIDL *)0x0;
    (jitInfo_00->functionBodyAddr).ptr = (void *)0x0;
    InitializePolymorphicInlineCacheInfo(recycler,&runtimeInfo->selfInfo,jitInfo_00);
    pSVar3 = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
             (runtimeInfo->inlineeInfo).
             super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
             super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
             super_SListNodeBase<Memory::Recycler>.next.ptr;
    Memory::Recycler::WBSetBit(local_70);
    local_70 = (undefined1  [8])pSVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_70);
    if (local_70 != (undefined1  [8])ptVar14) {
      uVar2 = (runtimeInfo->inlineeInfo).
              super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_RealCount.count;
      uVar15 = (ulong)uVar2;
      local_70 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_181aee2;
      data.filename._0_4_ = 0x22;
      data.plusSize = uVar15;
      pRVar9 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
      if (uVar15 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
        pPVar11 = (PolymorphicInlineCacheInfoIDL *)&DAT_00000008;
      }
      else {
        BVar8 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar7) goto LAB_0056ae10;
          *puVar10 = 0;
        }
        pPVar11 = (PolymorphicInlineCacheInfoIDL *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                            (pRVar9,uVar15 << 5);
        if (pPVar11 == (PolymorphicInlineCacheInfoIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar7) goto LAB_0056ae10;
          *puVar10 = 0;
        }
        sVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pPVar11->polymorphicCacheUtilizationArray).ptr + sVar12);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)&(pPVar11->functionBodyAddr).ptr + sVar12) = 0;
          sVar12 = sVar12 + 0x20;
        } while (uVar15 << 5 != sVar12);
      }
      uVar15 = 0;
      local_70 = (undefined1  [8])ptVar14;
      data.typeinfo = ptVar14;
      data._32_8_ = __tls_get_addr(&PTR_01548f08);
      while( true ) {
        if (ptVar14 == (type_info *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          uVar6 = data._32_8_;
          *(undefined4 *)data._32_8_ = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_0056ae10;
          *(undefined4 *)uVar6 = 0;
          ptVar14 = data.typeinfo;
        }
        auVar5 = local_70;
        ptVar14 = (type_info *)
                  (((SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                   &ptVar14->field_0x0)->
                  super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>).
                  super_SListNodeBase<Memory::Recycler>.next.ptr;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = (SListNodeBase<Memory::Recycler> *)ptVar14;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        if ((undefined1  [8])local_38.ptr == auVar5) break;
        ptVar14 = *(type_info **)data.typeinfo;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = (SListNodeBase<Memory::Recycler> *)ptVar14;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        data.typeinfo = (type_info *)local_38.ptr;
        pTVar13 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator
                  ::Data((Iterator *)local_70);
        InitializePolymorphicInlineCacheInfo(recycler,pTVar13->ptr,pPVar11 + uVar15);
        uVar15 = (ulong)((uint)uVar15 + 1);
        ptVar14 = data.typeinfo;
      }
      data.typeinfo = (type_info *)0x0;
      if (uVar2 != (uint)uVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        uVar6 = data._32_8_;
        *(undefined4 *)data._32_8_ = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
                           ,0x2c,"(i == inlineeCount)","i == inlineeCount");
        if (!bVar7) {
LAB_0056ae10:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *(undefined4 *)uVar6 = 0;
      }
    }
    jitInfo->inlineeInfoCount =
         (runtimeInfo->inlineeInfo).
         super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_RealCount.count;
    jitInfo->selfInfo = jitInfo_00;
    jitInfo->inlineeInfo = pPVar11;
  }
  return;
}

Assistant:

void
JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
    __in Recycler * recycler,
    __in Js::EntryPointPolymorphicInlineCacheInfo * runtimeInfo,
    __out CodeGenWorkItemIDL * jitInfo)
{
    if (runtimeInfo == nullptr)
    {
        return;
    }
    Js::PolymorphicInlineCacheInfo * selfInfo = runtimeInfo->GetSelfInfo();
    SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler> * inlineeList = runtimeInfo->GetInlineeInfo();
    PolymorphicInlineCacheInfoIDL* selfInfoIDL = RecyclerNewStructZ(recycler, PolymorphicInlineCacheInfoIDL);
    PolymorphicInlineCacheInfoIDL* inlineeInfoIDL = nullptr;

    JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, selfInfo, selfInfoIDL);
    
    if (!inlineeList->Empty())
    {
        const uint inlineeCount = inlineeList->Count();
        inlineeInfoIDL = RecyclerNewArray(recycler, PolymorphicInlineCacheInfoIDL, inlineeCount);
        SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(inlineeList);
        uint i = 0;
        while (iter.Next())
        {
            Js::PolymorphicInlineCacheInfo * inlineeInfo = iter.Data();
            __analysis_assume(i < inlineeCount);
            JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, inlineeInfo, &inlineeInfoIDL[i]);
            ++i;
        }
        Assert(i == inlineeCount);
    }
    jitInfo->inlineeInfoCount = inlineeList->Count();
    jitInfo->selfInfo = selfInfoIDL;
    jitInfo->inlineeInfo = inlineeInfoIDL;
}